

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

UINT8 __thiscall DROPlayer::SetDeviceMuting(DROPlayer *this,UINT32 id,PLR_MUTE_OPTS *muteOpts)

{
  ulong uVar1;
  pointer pDVar2;
  void *pvVar3;
  DEVFUNC_OPTMASK p_Var4;
  PLR_DEV_OPTS *pPVar5;
  undefined3 uVar6;
  UINT32 UVar7;
  UINT8 UVar8;
  size_t sVar9;
  
  sVar9 = DeviceID2OptionID(this,id);
  if (sVar9 == 0xffffffffffffffff) {
    UVar8 = 0x80;
  }
  else {
    this->_devOpts[sVar9].muteOpts.chnMute[1] = muteOpts->chnMute[1];
    uVar6 = *(undefined3 *)&muteOpts->field_0x1;
    UVar7 = muteOpts->chnMute[0];
    pPVar5 = this->_devOpts + sVar9;
    (pPVar5->muteOpts).disable = muteOpts->disable;
    *(undefined3 *)&(pPVar5->muteOpts).field_0x1 = uVar6;
    (pPVar5->muteOpts).chnMute[0] = UVar7;
    uVar1 = this->_optDevMap[sVar9];
    pDVar2 = (this->_devices).
             super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)(((long)(this->_devices).
                               super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 3) *
                       -0x30c30c30c30c30c3)) {
      pvVar3 = pDVar2[uVar1].base.defInf.dataPtr;
      if ((pvVar3 != (void *)0x0) &&
         (p_Var4 = (pDVar2[uVar1].base.defInf.devDef)->SetMuteMask, p_Var4 != (DEVFUNC_OPTMASK)0x0))
      {
        (*p_Var4)(pvVar3,this->_devOpts[sVar9].muteOpts.chnMute[0]);
      }
    }
    UVar8 = '\0';
  }
  return UVar8;
}

Assistant:

UINT8 DROPlayer::SetDeviceMuting(UINT32 id, const PLR_MUTE_OPTS& muteOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID].muteOpts = muteOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}